

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

int Acb_NtkFindSupp2(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp,int nLutSize,int fDelay)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  int Entry;
  lit lVar4;
  int *piVar5;
  int *piVar6;
  lit *plVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  char *__assertion;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  
  if (Pivot < 1) {
LAB_0037d2da:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if (Pivot < (p->vObjFans).nSize) {
    piVar5 = (p->vObjFans).pArray;
    iVar10 = piVar5[(uint)Pivot];
    if (((long)iVar10 < 0) || ((p->vFanSto).nSize <= iVar10)) {
LAB_0037d29c:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar6 = (p->vFanSto).pArray;
    puVar2 = (uint *)(piVar6 + iVar10);
    uVar11 = *puVar2;
    uVar13 = 0;
    uVar15 = 0;
    if (0 < (int)uVar11) {
      uVar15 = (ulong)uVar11;
    }
    while (uVar15 != uVar13) {
      uVar12 = puVar2[uVar13 + 1];
      if ((long)(int)uVar12 < 1) goto LAB_0037d217;
      uVar3 = (p->vObjFunc).nSize;
      if ((int)uVar3 < 1) goto LAB_0037d220;
      if (uVar3 <= uVar12) goto LAB_0037d1f8;
      iVar10 = (p->vObjFunc).pArray[(int)uVar12];
      if ((iVar10 < 0) || (uVar13 = uVar13 + 1, nDivs <= iVar10)) {
        __assert_fail("Acb_ObjFunc(p, iFanin) >= 0 && Acb_ObjFunc(p, iFanin) < nDivs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0x3ab,
                      "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
    }
    if (fDelay == 0) {
      if (0 < (int)uVar11) {
        lVar14 = 0;
        do {
          uVar12 = puVar2[lVar14 + 1];
          lVar20 = (long)(int)uVar12;
          if (lVar20 < 1) {
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
          }
          if ((p->vObjType).nSize <= (int)uVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if ((p->vObjType).pArray[lVar20] != '\x03') {
            if ((p->vFanouts).nSize <= (int)uVar12) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            if ((p->vFanouts).pArray[lVar20].nSize == 1) {
              vSupp->nSize = 0;
              iVar10 = (p->vObjFans).nSize;
              if (iVar10 <= Pivot) goto LAB_0037d1f8;
              iVar9 = (p->vObjFans).pArray[(uint)Pivot];
              lVar16 = (long)iVar9;
              if ((lVar16 < 0) || ((p->vFanSto).nSize <= iVar9)) goto LAB_0037d29c;
              piVar5 = (p->vFanSto).pArray;
              iVar9 = piVar5[lVar16];
              if (0 < iVar9) {
                lVar19 = 0;
                do {
                  if (uVar12 != piVar5[lVar16 + lVar19 + 1]) {
                    Vec_IntPush(vSupp,piVar5[lVar16 + lVar19 + 1]);
                    iVar9 = piVar5[lVar16];
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 < iVar9);
                iVar10 = (p->vObjFans).nSize;
              }
              if (iVar10 <= (int)uVar12) goto LAB_0037d1f8;
              iVar10 = (p->vObjFans).pArray[lVar20];
              lVar20 = (long)iVar10;
              if ((lVar20 < 0) || ((p->vFanSto).nSize <= iVar10)) goto LAB_0037d29c;
              piVar5 = (p->vFanSto).pArray;
              iVar10 = piVar5[lVar20];
              if (0 < iVar10) {
                piVar5 = piVar5 + lVar20;
                lVar20 = 0;
                do {
                  iVar9 = piVar5[lVar20 + 1];
                  if (0 < (long)vSupp->nSize) {
                    lVar16 = 0;
                    do {
                      if (vSupp->pArray[lVar16] == iVar9) goto LAB_0037cd5e;
                      lVar16 = lVar16 + 1;
                    } while (vSupp->nSize != lVar16);
                  }
                  Vec_IntPush(vSupp,iVar9);
                  iVar10 = *piVar5;
LAB_0037cd5e:
                  lVar20 = lVar20 + 1;
                } while (lVar20 < iVar10);
              }
              plVar7 = vSupp->pArray;
              iVar10 = vSupp->nSize;
              if (1 < (long)iVar10) {
                uVar15 = 1;
                uVar13 = 0;
                do {
                  uVar1 = uVar13 + 1;
                  uVar17 = uVar13 & 0xffffffff;
                  uVar18 = uVar15;
                  do {
                    iVar9 = plVar7[uVar18];
                    if (((long)iVar9 < 0) || (uVar11 = (p->vLevelD).nSize, (int)uVar11 <= iVar9))
                    goto LAB_0037d1f8;
                    uVar12 = plVar7[(int)uVar17];
                    if (((long)(int)uVar12 < 0) || (uVar11 <= uVar12)) goto LAB_0037d1f8;
                    piVar5 = (p->vLevelD).pArray;
                    uVar8 = uVar18 & 0xffffffff;
                    if (piVar5[(int)uVar12] <= piVar5[iVar9]) {
                      uVar8 = uVar17;
                    }
                    uVar17 = uVar8;
                    uVar18 = uVar18 + 1;
                  } while ((long)iVar10 != uVar18);
                  lVar4 = plVar7[uVar13];
                  plVar7[uVar13] = plVar7[(int)uVar17];
                  plVar7[(int)uVar17] = lVar4;
                  uVar15 = uVar15 + 1;
                  uVar13 = uVar1;
                } while (uVar1 != iVar10 - 1);
                iVar10 = vSupp->nSize;
              }
              if (iVar10 < 1) {
LAB_0037ce88:
                lVar20 = (long)iVar10;
              }
              else {
                lVar20 = 0;
                do {
                  uVar11 = plVar7[lVar20];
                  if ((long)(int)uVar11 < 1) goto LAB_0037d217;
                  uVar12 = (p->vObjFunc).nSize;
                  if ((int)uVar12 < 1) goto LAB_0037d220;
                  if (uVar12 <= uVar11) goto LAB_0037d1f8;
                  iVar10 = (p->vObjFunc).pArray[(int)uVar11];
                  if (iVar10 < 0) {
                    __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                  ,0x382,
                                  "void Acb_NtkRemapIntoSatVariables(Acb_Ntk_t *, Vec_Int_t *)");
                  }
                  plVar7[lVar20] = iVar10;
                  lVar20 = lVar20 + 1;
                  iVar10 = vSupp->nSize;
                } while (lVar20 < iVar10);
                if (iVar10 < 1) goto LAB_0037ce88;
                lVar16 = 0;
                do {
                  iVar10 = plVar7[lVar16] + nVars * 2;
                  if (iVar10 < 0) goto LAB_0037d27d;
                  plVar7[lVar16] = iVar10 * 2;
                  lVar16 = lVar16 + 1;
                  lVar20 = (long)vSupp->nSize;
                } while (lVar16 < lVar20);
              }
              iVar10 = sat_solver_solve(pSat,plVar7,plVar7 + lVar20,0,0,0,0);
              if (iVar10 != -1) {
                printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
                __assert_fail("status == l_False",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                              ,0x3e5,
                              "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              iVar10 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
              if (vSupp->nSize < iVar10) {
LAB_0037d356:
                __assert_fail("p->nSize >= nSizeNew",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
              }
              vSupp->nSize = iVar10;
              if (0 < iVar10) {
                piVar5 = vSupp->pArray;
                lVar20 = 0;
                do {
                  uVar11 = piVar5[lVar20];
                  if ((int)uVar11 < 0) goto LAB_0037d23f;
                  piVar5[lVar20] = (uVar11 >> 1) + nVars * -2;
                  lVar20 = lVar20 + 1;
                  iVar10 = vSupp->nSize;
                } while (lVar20 < iVar10);
              }
              if (iVar10 <= nLutSize) {
                return 1;
              }
              uVar11 = *puVar2;
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (int)uVar11);
      }
      return 0;
    }
    if (Pivot < (p->vLevelD).nSize) {
      if ((p->vLevelD).pArray[(uint)Pivot] < 2) {
        __assert_fail("Acb_ObjLevelD( p, Pivot ) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0x3b0,
                      "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
      vSupp->nSize = 0;
      iVar10 = (p->vObjFans).nSize;
      if (Pivot < iVar10) {
        iVar9 = piVar5[(uint)Pivot];
        lVar14 = (long)iVar9;
        if ((-1 < lVar14) && (iVar9 < (p->vFanSto).nSize)) {
          if (piVar6[lVar14] < 1) {
            iVar9 = 0;
          }
          else {
            lVar20 = 0;
            do {
              iVar10 = piVar6[lVar14 + lVar20 + 1];
              iVar9 = Acb_ObjIsDelayCriticalFanin(p,Pivot,iVar10);
              if (iVar9 == 0) {
                Vec_IntPush(vSupp,iVar10);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < piVar6[lVar14]);
            iVar9 = vSupp->nSize;
            iVar10 = (p->vObjFans).nSize;
          }
          if (iVar10 <= Pivot) goto LAB_0037d1f8;
          iVar10 = (p->vObjFans).pArray[(uint)Pivot];
          lVar14 = (long)iVar10;
          if ((lVar14 < 0) || ((p->vFanSto).nSize <= iVar10)) goto LAB_0037d29c;
          piVar5 = (p->vFanSto).pArray;
          iVar10 = iVar9;
          if (0 < piVar5[lVar14]) {
            piVar5 = piVar5 + lVar14;
            lVar14 = 0;
            do {
              uVar11 = piVar5[lVar14 + 1];
              iVar10 = Acb_ObjIsDelayCriticalFanin(p,Pivot,uVar11);
              if (iVar10 != 0) {
                if ((int)uVar11 < 1) goto LAB_0037d2da;
                if ((p->vObjFans).nSize <= (int)uVar11) goto LAB_0037d1f8;
                iVar10 = (p->vObjFans).pArray[uVar11];
                lVar20 = (long)iVar10;
                if ((lVar20 < 0) || ((p->vFanSto).nSize <= iVar10)) goto LAB_0037d29c;
                piVar6 = (p->vFanSto).pArray;
                iVar10 = piVar6[lVar20];
                if (0 < iVar10) {
                  piVar6 = piVar6 + lVar20;
                  lVar20 = 0;
                  do {
                    Entry = piVar6[lVar20 + 1];
                    if (0 < (long)vSupp->nSize) {
                      lVar16 = 0;
                      do {
                        if (vSupp->pArray[lVar16] == Entry) goto LAB_0037d00e;
                        lVar16 = lVar16 + 1;
                      } while (vSupp->nSize != lVar16);
                    }
                    Vec_IntPush(vSupp,Entry);
                    iVar10 = *piVar6;
LAB_0037d00e:
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < iVar10);
                }
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < *piVar5);
            iVar10 = vSupp->nSize;
          }
          uVar11 = iVar10 - iVar9;
          if (uVar11 == 0 || iVar10 < iVar9) {
            __assert_fail("nNonCrits < Vec_IntSize(vSupp)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                          ,0x3bb,
                          "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                         );
          }
          plVar7 = vSupp->pArray;
          if (1 < (int)uVar11) {
            uVar15 = 1;
            uVar13 = 0;
            do {
              uVar1 = uVar13 + 1;
              uVar17 = uVar13 & 0xffffffff;
              uVar18 = uVar15;
              do {
                iVar10 = plVar7[(long)iVar9 + uVar18];
                if (((long)iVar10 < 0) || (uVar12 = (p->vLevelD).nSize, (int)uVar12 <= iVar10))
                goto LAB_0037d1f8;
                uVar3 = plVar7[(long)iVar9 + (long)(int)(uint)uVar17];
                if (((long)(int)uVar3 < 0) || (uVar12 <= uVar3)) goto LAB_0037d1f8;
                piVar5 = (p->vLevelD).pArray;
                uVar12 = (uint)uVar18;
                if (piVar5[(int)uVar3] <= piVar5[iVar10]) {
                  uVar12 = (uint)uVar17;
                }
                uVar18 = uVar18 + 1;
                uVar17 = (ulong)uVar12;
              } while (uVar11 != uVar18);
              lVar4 = plVar7[(long)iVar9 + uVar13];
              plVar7[(long)iVar9 + uVar13] = plVar7[(long)iVar9 + (long)(int)uVar12];
              plVar7[(long)iVar9 + (long)(int)uVar12] = lVar4;
              uVar15 = uVar15 + 1;
              uVar13 = uVar1;
            } while (uVar1 != uVar11 - 1);
            iVar10 = vSupp->nSize;
          }
          if (iVar10 < 1) {
LAB_0037d168:
            lVar14 = (long)iVar10;
          }
          else {
            lVar14 = 0;
            do {
              uVar11 = plVar7[lVar14];
              if ((long)(int)uVar11 < 1) {
LAB_0037d217:
                __assertion = "i>0";
LAB_0037d227:
                __assert_fail(__assertion,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                              ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
              }
              uVar12 = (p->vObjFunc).nSize;
              if ((int)uVar12 < 1) {
LAB_0037d220:
                __assertion = "Acb_NtkHasObjFuncs(p)";
                goto LAB_0037d227;
              }
              if (uVar12 <= uVar11) goto LAB_0037d1f8;
              iVar10 = (p->vObjFunc).pArray[(int)uVar11];
              if (iVar10 < 0) {
                __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                              ,0x3c1,
                              "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              plVar7[lVar14] = iVar10;
              lVar14 = lVar14 + 1;
              iVar10 = vSupp->nSize;
            } while (lVar14 < iVar10);
            if (iVar10 < 1) goto LAB_0037d168;
            lVar20 = 0;
            do {
              iVar10 = plVar7[lVar20] + nVars * 2;
              if (iVar10 < 0) {
LAB_0037d27d:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              plVar7[lVar20] = iVar10 * 2;
              lVar20 = lVar20 + 1;
              lVar14 = (long)vSupp->nSize;
            } while (lVar20 < lVar14);
          }
          iVar10 = sat_solver_solve(pSat,plVar7,plVar7 + lVar14,0,0,0,0);
          if (iVar10 != -1) {
            printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
            __assert_fail("status == l_False",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                          ,0x3c9,
                          "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                         );
          }
          iVar10 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
          if (iVar10 <= vSupp->nSize) {
            vSupp->nSize = iVar10;
            if (0 < iVar10) {
              piVar5 = vSupp->pArray;
              lVar14 = 0;
              do {
                uVar11 = piVar5[lVar14];
                if ((int)uVar11 < 0) {
LAB_0037d23f:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                piVar5[lVar14] = (uVar11 >> 1) + nVars * -2;
                lVar14 = lVar14 + 1;
                iVar10 = vSupp->nSize;
              } while (lVar14 < iVar10);
            }
            return (uint)(iVar10 <= nLutSize);
          }
          goto LAB_0037d356;
        }
        goto LAB_0037d29c;
      }
    }
  }
LAB_0037d1f8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Acb_NtkFindSupp2( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp, int nLutSize, int fDelay )
{
    int nSuppNew, status, k, iFanin, * pFanins, k2, iFanin2, * pFanins2;
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        assert( Acb_ObjFunc(p, iFanin) >= 0 && Acb_ObjFunc(p, iFanin) < nDivs );
    if ( fDelay )
    {
        // add non-timing-critical fanins
        int nNonCrits, k2, iFanin2 = 0, * pFanins2;
        assert( Acb_ObjLevelD( p, Pivot ) > 1 );
        Vec_IntClear( vSupp );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Vec_IntPush( vSupp, iFanin );
        nNonCrits = Vec_IntSize(vSupp);
        // add fanins of timing critical fanins
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
                    Vec_IntPushUnique( vSupp, iFanin2 );
        assert( nNonCrits < Vec_IntSize(vSupp) );
        // sort additional fanins by level
        Vec_IntSelectSortCost( Vec_IntArray(vSupp) + nNonCrits, Vec_IntSize(vSupp) - nNonCrits, &p->vLevelD );
        // translate to SAT vars
        Vec_IntForEachEntry( vSupp, iFanin, k )
        {
            assert( Acb_ObjFunc(p, iFanin) >= 0 );
            Vec_IntWriteEntry( vSupp, k, Acb_ObjFunc(p, iFanin) );
        }
        // solve for these fanins
        Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status != l_False )
            printf( "Failed internal check at node %d.\n", Pivot );
        assert( status == l_False );
        nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
        Vec_IntShrink( vSupp, nSuppNew );
        Vec_IntLits2Vars( vSupp, -2*nVars );
        return Vec_IntSize(vSupp) <= nLutSize;
    }
    // iterate through different fanout free cones
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        // collect fanins of the root node
        Vec_IntClear( vSupp );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins2, iFanin2, k2 )
            if ( iFanin != iFanin2 )
                Vec_IntPush( vSupp, iFanin2 );
        // collect fanins of the selected node
        Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
            Vec_IntPushUnique( vSupp, iFanin2 );
        // sort fanins by level
        Vec_IntSelectSortCost( Vec_IntArray(vSupp), Vec_IntSize(vSupp), &p->vLevelD );
        //Acb_NtkOrderByRefCount( p, vSupp );
        Acb_NtkRemapIntoSatVariables( p, vSupp );
        // solve for these fanins
        Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status != l_False )
            printf( "Failed internal check at node %d.\n", Pivot );
        assert( status == l_False );
        nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
        Vec_IntShrink( vSupp, nSuppNew );
        Vec_IntLits2Vars( vSupp, -2*nVars );
        if ( Vec_IntSize(vSupp) <= nLutSize )
            return 1;
    }
    return 0;
}